

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inversespectrogram.cpp
# Opt level: O3

int __thiscall
ncnn::InverseSpectrogram::forward
          (InverseSpectrogram *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  void *pvVar6;
  int *piVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  float *pfVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  float *pfVar19;
  uint uVar20;
  undefined4 *puVar21;
  uint *puVar22;
  uint *puVar23;
  undefined4 *puVar24;
  int k;
  long lVar25;
  long lVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  ulong local_160;
  float local_118;
  float local_114;
  ulong local_110;
  Mat local_108;
  long local_b8;
  void *local_b0;
  void *local_a8;
  ulong local_a0;
  float *local_98;
  long local_90;
  double local_88;
  double local_80;
  Mat local_78;
  
  local_110 = (ulong)(uint)bottom_blob->h;
  iVar2 = bottom_blob->c;
  iVar3 = this->n_fft;
  uVar15 = iVar3 - (iVar3 >> 0x1f) & 0xfffffffe;
  if (this->center == 0) {
    uVar15 = 0;
  }
  uVar15 = (iVar3 - uVar15) + (bottom_blob->h - 1U) * this->hoplen;
  sVar4 = bottom_blob->elemsize;
  if (this->returns == 0) {
    Mat::create(top_blob,2,uVar15,sVar4,opt->blob_allocator);
  }
  else {
    Mat::create(top_blob,uVar15,sVar4,opt->blob_allocator);
  }
  iVar10 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    local_78.cstep = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78._20_8_ = 0;
    local_78.allocator = (Allocator *)0x0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    Mat::create(&local_78,this->n_fft + uVar15,sVar4,opt->workspace_allocator);
    sVar4 = local_78.cstep;
    pvVar6 = local_78.data;
    iVar10 = -100;
    if ((local_78.data != (void *)0x0) &&
       (iVar8 = local_78.c, local_78.cstep * (long)local_78.c != 0)) {
      uVar9 = top_blob->c * (int)top_blob->cstep;
      if (0 < (int)uVar9) {
        memset(top_blob->data,0,(ulong)uVar9 << 2);
      }
      uVar9 = iVar8 * (int)sVar4;
      if (0 < (int)uVar9) {
        memset(pvVar6,0,(ulong)uVar9 << 2);
      }
      if (0 < (int)local_110) {
        local_160 = 0;
        do {
          local_108.cstep = 0;
          local_108.data = (void *)0x0;
          local_108.refcount._0_4_ = 0;
          local_108.refcount._4_4_ = 0;
          local_108.elemsize._0_4_ = 0;
          local_108.elemsize._4_4_ = 0;
          local_108.elempack = 0;
          local_108.h = 0;
          local_108.d = 0;
          local_108.c = 0;
          local_108.allocator = (Allocator *)0x0;
          local_108.dims = 0;
          local_108.w = 0;
          Mat::create(&local_108,2,this->n_fft,4,(Allocator *)0x0);
          uVar9 = this->n_fft;
          lVar26 = (long)(int)uVar9;
          if (iVar2 == iVar3 / 2 + 1) {
            iVar10 = (int)uVar9 / 2;
            if (-2 < (int)uVar9) {
              sVar4 = bottom_blob->elemsize;
              puVar21 = (undefined4 *)((long)local_108.data + 4);
              uVar13 = (ulong)(iVar10 + 1);
              sVar5 = bottom_blob->cstep;
              puVar24 = (undefined4 *)
                        ((long)bottom_blob->data + sVar4 * local_160 * (long)bottom_blob->w + 4);
              do {
                puVar21[-1] = puVar24[-1];
                *puVar21 = *puVar24;
                puVar24 = (undefined4 *)((long)puVar24 + sVar4 * sVar5);
                puVar21 = (undefined4 *)
                          ((long)puVar21 +
                          (long)local_108.w *
                          CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize));
                uVar13 = uVar13 - 1;
              } while (uVar13 != 0);
            }
            if (iVar10 + 1 < (int)uVar9) {
              sVar4 = bottom_blob->cstep;
              sVar5 = bottom_blob->elemsize;
              lVar12 = ~(long)iVar10 + lVar26;
              puVar22 = (uint *)((long)bottom_blob->data +
                                ((long)bottom_blob->w * local_160 + sVar4 * lVar12) * sVar5 + 4);
              lVar16 = (long)local_108.w *
                       CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize);
              puVar23 = (uint *)((long)local_108.data + (iVar10 + 1) * lVar16 + 4);
              do {
                puVar23[-1] = puVar22[-1];
                *puVar23 = *puVar22 ^ 0x80000000;
                puVar22 = (uint *)((long)puVar22 - sVar4 * sVar5);
                puVar23 = (uint *)((long)puVar23 + lVar16);
                lVar12 = lVar12 + -1;
              } while (lVar12 != 0);
            }
          }
          else if (0 < (int)uVar9) {
            sVar4 = bottom_blob->elemsize;
            puVar21 = (undefined4 *)((long)local_108.data + 4);
            sVar5 = bottom_blob->cstep;
            puVar24 = (undefined4 *)
                      ((long)bottom_blob->data + sVar4 * local_160 * (long)bottom_blob->w + 4);
            lVar12 = lVar26;
            do {
              puVar21[-1] = puVar24[-1];
              *puVar21 = *puVar24;
              puVar24 = (undefined4 *)((long)puVar24 + sVar4 * sVar5);
              puVar21 = (undefined4 *)
                        ((long)puVar21 +
                        (long)local_108.w *
                        CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize));
              lVar12 = lVar12 + -1;
            } while (lVar12 != 0);
          }
          if (this->normalized == 2) {
            if (0 < (int)uVar9) {
              fVar28 = *(float *)((long)(this->window_data).data + lVar26 * 4);
              uVar13 = (ulong)(uVar9 * 2);
              if ((int)(uVar9 * 2) < 2) {
                uVar13 = 1;
              }
              uVar17 = 0;
              do {
                *(float *)((long)local_108.data + uVar17 * 4) =
                     *(float *)((long)local_108.data + uVar17 * 4) * fVar28;
                uVar17 = uVar17 + 1;
              } while (uVar13 != uVar17);
              goto LAB_005a0d54;
            }
          }
          else {
            if (this->normalized == 1) {
              if ((int)uVar9 < 1) goto LAB_005a0fad;
              uVar13 = (ulong)(uVar9 * 2);
              if ((int)(uVar9 * 2) < 2) {
                uVar13 = 1;
              }
              uVar17 = 0;
              do {
                *(float *)((long)local_108.data + uVar17 * 4) =
                     *(float *)((long)local_108.data + uVar17 * 4) * SQRT((float)(int)uVar9);
                uVar17 = uVar17 + 1;
              } while (uVar13 != uVar17);
            }
LAB_005a0d54:
            if (0 < (int)uVar9) {
              local_88 = 1.0 / (double)(int)uVar9;
              lVar12 = (long)local_108.w;
              local_a8 = (this->window_data).data;
              local_a0 = (ulong)(uint)(this->hoplen * (int)local_160);
              iVar10 = this->returns;
              uVar20 = uVar9 >> 1;
              local_b8 = (long)top_blob->w * top_blob->elemsize;
              local_b0 = local_78.data;
              pvVar6 = top_blob->data;
              if (this->center != 1) {
                uVar20 = 0;
              }
              local_98 = (float *)((long)local_108.data + 4);
              lVar16 = CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize);
              lVar18 = 0;
              do {
                local_80 = (double)(int)lVar18 * 6.283185307179586;
                fVar28 = 0.0;
                lVar25 = 0;
                fVar29 = 0.0;
                pfVar19 = local_98;
                local_90 = lVar18;
                do {
                  sincosf((float)((double)(int)lVar25 * local_80 * local_88),&local_114,&local_118);
                  fVar29 = (fVar29 + pfVar19[-1] * local_118) - *pfVar19 * local_114;
                  fVar28 = *pfVar19 * local_118 + pfVar19[-1] * local_114 + fVar28;
                  lVar25 = lVar25 + 1;
                  pfVar19 = (float *)((long)pfVar19 + lVar12 * lVar16);
                } while (lVar26 != lVar25);
                uVar11 = ((int)local_a0 + (int)local_90) - uVar20;
                if ((-1 < (int)uVar11) && ((int)uVar11 < (int)uVar15)) {
                  fVar1 = *(float *)((long)local_a8 + local_90 * 4);
                  fVar27 = fVar1 * (1.0 / (float)(int)uVar9);
                  fVar28 = fVar28 * fVar27;
                  uVar13 = (ulong)uVar11;
                  *(float *)((long)local_b0 + uVar13 * 4) =
                       fVar1 * fVar1 + *(float *)((long)local_b0 + uVar13 * 4);
                  if (iVar10 == 2) {
                    pfVar19 = (float *)((long)pvVar6 + uVar13 * 4);
                  }
                  else {
                    fVar27 = fVar27 * fVar29;
                    if (iVar10 == 1) {
                      pfVar19 = (float *)((long)pvVar6 + uVar13 * 4);
                      fVar28 = fVar27;
                    }
                    else {
                      if (iVar10 != 0) goto LAB_005a0fa1;
                      pfVar14 = (float *)(uVar13 * local_b8 + (long)pvVar6);
                      pfVar19 = pfVar14 + 1;
                      *pfVar14 = fVar27 + *pfVar14;
                    }
                  }
                  *pfVar19 = fVar28 + *pfVar19;
                }
LAB_005a0fa1:
                lVar18 = local_90 + 1;
              } while (lVar18 != lVar26);
            }
          }
LAB_005a0fad:
          piVar7 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              if (local_108.allocator == (Allocator *)0x0) {
                if (local_108.data != (void *)0x0) {
                  free(local_108.data);
                }
              }
              else {
                (*(local_108.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_160 = local_160 + 1;
        } while (local_160 != local_110);
      }
      if (this->returns == 0) {
        if (0 < (int)uVar15) {
          iVar2 = top_blob->w;
          sVar4 = top_blob->elemsize;
          pfVar19 = (float *)((long)top_blob->data + 4);
          uVar13 = 0;
          do {
            fVar28 = *(float *)((long)local_78.data + uVar13 * 4);
            if (fVar28 != 0.0) {
              pfVar19[-1] = pfVar19[-1] / fVar28;
              *pfVar19 = *pfVar19 / *(float *)((long)local_78.data + uVar13 * 4);
            }
            uVar13 = uVar13 + 1;
            pfVar19 = (float *)((long)pfVar19 + (long)iVar2 * sVar4);
          } while (uVar15 != uVar13);
        }
      }
      else if (0 < (int)uVar15) {
        pvVar6 = top_blob->data;
        uVar13 = 0;
        do {
          fVar28 = *(float *)((long)local_78.data + uVar13 * 4);
          if (fVar28 != 0.0) {
            *(float *)((long)pvVar6 + uVar13 * 4) = *(float *)((long)pvVar6 + uVar13 * 4) / fVar28;
          }
          uVar13 = uVar13 + 1;
        } while (uVar15 != uVar13);
      }
      iVar10 = 0;
    }
    piVar7 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if (local_78.data != (void *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return iVar10;
}

Assistant:

int InverseSpectrogram::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // https://github.com/librosa/librosa/blob/main/librosa/core/spectrum.py#L630

    // TODO custom window
    // TODO output length

    const int frames = bottom_blob.h;
    const int freqs = bottom_blob.c;
    // assert freqs == n_fft or freqs == n_fft / 2 + 1

    const int onesided = freqs == n_fft / 2 + 1 ? 1 : 0;

    const int outsize = center ? (frames - 1) * hoplen + (n_fft - n_fft / 2 * 2) : (frames - 1) * hoplen + n_fft;

    const size_t elemsize = bottom_blob.elemsize;

    if (returns == 0)
    {
        top_blob.create(2, outsize, elemsize, opt.blob_allocator);
    }
    else
    {
        top_blob.create(outsize, elemsize, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    Mat window_sumsquare(outsize + n_fft, elemsize, opt.workspace_allocator);
    if (window_sumsquare.empty())
        return -100;

    top_blob.fill(0.f);
    window_sumsquare.fill(0.f);

    for (int j = 0; j < frames; j++)
    {
        // collect complex
        Mat sp(2, n_fft);
        if (onesided == 1)
        {
            for (int k = 0; k < n_fft / 2 + 1; k++)
            {
                sp.row(k)[0] = bottom_blob.channel(k).row(j)[0];
                sp.row(k)[1] = bottom_blob.channel(k).row(j)[1];
            }
            for (int k = n_fft / 2 + 1; k < n_fft; k++)
            {
                sp.row(k)[0] = bottom_blob.channel(n_fft - k).row(j)[0];
                sp.row(k)[1] = -bottom_blob.channel(n_fft - k).row(j)[1];
            }
        }
        else
        {
            for (int k = 0; k < n_fft; k++)
            {
                sp.row(k)[0] = bottom_blob.channel(k).row(j)[0];
                sp.row(k)[1] = bottom_blob.channel(k).row(j)[1];
            }
        }

        if (normalized == 1)
        {
            float norm = sqrt(n_fft);
            for (int i = 0; i < 2 * n_fft; i++)
            {
                sp[i] *= norm;
            }
        }
        if (normalized == 2)
        {
            float norm = window_data[n_fft];
            for (int i = 0; i < 2 * n_fft; i++)
            {
                sp[i] *= norm;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < n_fft; i++)
        {
            // inverse dft
            float re = 0.f;
            float im = 0.f;
            for (int k = 0; k < n_fft; k++)
            {
                double angle = 2 * 3.14159265358979323846 * i * k / n_fft;

                re += sp.row(k)[0] * cosf(angle) - sp.row(k)[1] * sinf(angle);
                im += sp.row(k)[0] * sinf(angle) + sp.row(k)[1] * cosf(angle);
            }

            re /= n_fft;
            im /= n_fft;

            // apply window
            re *= window_data[i];
            im *= window_data[i];

            int output_index = j * hoplen + i;
            if (center == 1)
            {
                output_index -= n_fft / 2;
            }
            if (output_index >= 0 && output_index < outsize)
            {
                // square window
                window_sumsquare[output_index] += window_data[i] * window_data[i];

                if (returns == 0)
                {
                    top_blob.row(output_index)[0] += re;
                    top_blob.row(output_index)[1] += im;
                }
                if (returns == 1)
                {
                    top_blob[output_index] += re;
                }
                if (returns == 2)
                {
                    top_blob[output_index] += im;
                }
            }
        }
    }

    // square window norm
    if (returns == 0)
    {
        for (int i = 0; i < outsize; i++)
        {
            if (window_sumsquare[i] != 0.f)
            {
                top_blob.row(i)[0] /= window_sumsquare[i];
                top_blob.row(i)[1] /= window_sumsquare[i];
            }
        }
    }
    else
    {
        for (int i = 0; i < outsize; i++)
        {
            if (window_sumsquare[i] != 0.f)
                top_blob[i] /= window_sumsquare[i];
        }
    }

    return 0;
}